

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall
Inject::context_nesting_override_binding::test_method(context_nesting_override_binding *this)

{
  int iVar1;
  ptr_type *ppVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Rb_tree_node_base local_260;
  undefined8 *local_240;
  char *local_238;
  injected<Inject::service> p_1;
  _Base_ptr local_220;
  component<Inject::impl2> y;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  injected<Inject::service> p2;
  undefined **local_1f0;
  _Base_ptr local_1e8;
  shared_count sStack_1e0;
  _Base_ptr local_1d8;
  undefined **local_1d0;
  undefined1 local_1c8 [16];
  _Base_ptr local_1b8;
  injected<Inject::service> p;
  char *local_1a0;
  context<0> *local_198;
  shared_count sStack_190;
  _Base_ptr local_188;
  provides<Inject::service> yy;
  provides<Inject::service> xxx;
  context<0> c_1;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::impl1>::component(&xx);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  inject::context<0>::component<Inject::impl2>::component(&y);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides(&yy);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&p);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0xb4);
  local_260._M_right._0_1_ = 0;
  local_260._M_left = (_Base_ptr)&PTR__lazy_ostream_00163f68;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = "";
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr(&p);
  iVar1 = (**ppVar2->px->_vptr_service)();
  local_260._0_8_ = CONCAT44(extraout_var,iVar1);
  local_260._M_parent = (_Base_ptr)inject::id_of<Inject::impl1>::id();
  p_1._ptr.px = (element_type *)&local_260._M_parent;
  p2._ptr.px = (element_type *)&local_260;
  local_1f0 = (undefined **)
              CONCAT71(local_1f0._1_7_,(_Base_ptr)local_260._0_8_ == local_260._M_parent);
  local_1e8 = (_Base_ptr)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_198 = (context<0> *)0x15209c;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&p2;
  c_1._bindings._M_t._M_impl._0_1_ = 0;
  c_1._vptr_context = (_func_int **)&PTR__lazy_ostream_00163fb8;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &boost::unit_test::lazy_ostream::inst;
  local_1b8 = (_Base_ptr)&p_1;
  local_1c8[0] = 0;
  local_1d0 = &PTR__lazy_ostream_00163fb8;
  local_1c8._8_8_ = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_260._M_left,&local_1a0,0xb4,1,2,2,"p->id()",&c_1,"id_of<impl1>::id()"
             ,&local_1d0);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c_1._vptr_context = (_func_int **)&PTR__context_00163e68;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c_1._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c_1;
  inject::context<0>::current()::_current = &c_1;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c_1._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl2,(inject::component_scope)0>(&c_1);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&p_1);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xba);
  local_1e8 = (_Base_ptr)((ulong)local_1e8 & 0xffffffffffffff00);
  local_1f0 = &PTR__lazy_ostream_00163f68;
  sStack_1e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1d8 = (_Base_ptr)0x152778;
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr(&p_1);
  iVar1 = (**ppVar2->px->_vptr_service)();
  local_220 = (_Base_ptr)CONCAT44(extraout_var_00,iVar1);
  local_188 = (_Base_ptr)inject::id_of<Inject::impl2>::id();
  local_260._M_parent = (_Base_ptr)&local_188;
  local_1a0 = (char *)CONCAT71(local_1a0._1_7_,
                               (_Base_ptr)CONCAT44(extraout_var_00,iVar1) == local_188);
  local_198 = (context<0> *)0x0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  p2._ptr.px = (element_type *)anon_var_dwarf_1563b;
  p2._ptr.pn.pi_ = (sp_counted_base *)0x15209c;
  local_1c8[0] = 0;
  local_1d0 = &PTR__lazy_ostream_00163fb8;
  local_1c8._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_260;
  local_260._M_right._0_1_ = 0;
  local_260._M_left = (_Base_ptr)&PTR__lazy_ostream_00163fb8;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = (char *)&local_260._M_parent;
  local_260._0_8_ = &local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_1f0,&p2,0xba,1,2,2,"p->id()",&local_1d0,"id_of<impl2>::id()",
             &local_260._M_left);
  boost::detail::shared_count::~shared_count(&sStack_190);
  boost::detail::shared_count::~shared_count(&p_1._ptr.pn);
  c_1._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = c_1._parent;
  inject::context<0>::current()::_current = c_1._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c_1._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c_1._bindings._M_t);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&p2);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0xbe);
  local_260._M_right._0_1_ = 0;
  local_260._M_left = (_Base_ptr)&PTR__lazy_ostream_00163f68;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = "";
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr(&p2);
  iVar1 = (**ppVar2->px->_vptr_service)();
  local_260._M_parent = (_Base_ptr)CONCAT44(extraout_var_01,iVar1);
  local_220 = (_Base_ptr)inject::id_of<Inject::impl1>::id();
  local_1f0 = (undefined **)
              CONCAT71(local_1f0._1_7_,(_Base_ptr)CONCAT44(extraout_var_01,iVar1) == local_220);
  local_1e8 = (_Base_ptr)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_198 = (context<0> *)0x15209c;
  p_1._ptr.px = (element_type *)&local_260._M_parent;
  c_1._bindings._M_t._M_impl._0_1_ = 0;
  c_1._vptr_context = (_func_int **)&PTR__lazy_ostream_00163fb8;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &boost::unit_test::lazy_ostream::inst;
  c_1._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&p_1;
  local_260._0_8_ = &local_220;
  local_1c8[0] = 0;
  local_1d0 = &PTR__lazy_ostream_00163fb8;
  local_1c8._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_260._M_left,&local_1a0,0xbe,1,2,2,"p2->id()",&c_1,
             "id_of<impl1>::id()",&local_1d0);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  boost::detail::shared_count::~shared_count(&p2._ptr.pn);
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = c._parent;
  inject::context<0>::current()::_current = c._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c._bindings._M_t);
  inject::context<0>::component<Inject::impl2>::~component(&y);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(context_nesting_override_binding)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<impl2> y;
    context<>::component<impl2>::provides<service> yy;

    context<> c;
    c.bind<service, impl1>();
    context<>::injected<service> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());

    {
        context<> c;
        c.bind<service, impl2>();
        context<>::injected<service> p;
        BOOST_CHECK_EQUAL(p->id(), id_of<impl2>::id());
    }
    
    context<>::injected<service> p2;
    BOOST_CHECK_EQUAL(p2->id(), id_of<impl1>::id());
}